

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomWidget::write(DomWidget *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  long lVar2;
  QString *pQVar3;
  DomProperty **ppDVar4;
  DomRow **ppDVar5;
  DomColumn **ppDVar6;
  DomItem **ppDVar7;
  DomLayout **ppDVar8;
  DomWidget **ppDVar9;
  DomAction **ppDVar10;
  DomActionGroup **ppDVar11;
  DomActionRef **ppDVar12;
  long lVar13;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  long in_FS_OFFSET;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QString local_50;
  long local_38;
  
  aVar14._4_4_ = in_register_00000034;
  aVar14._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"widget";
    local_50.d.size = 6;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar15.m_size = (size_t)local_50.d.ptr;
  QVar15.field_0.m_data = aVar14.m_data;
  QXmlStreamWriter::writeStartElement(QVar15);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_class == true) {
    pQVar1 = &((this->m_attr_class).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_class).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar17.m_size = (size_t)L"class";
      QVar17.field_0.m_data = aVar14.m_data;
      QVar24.m_size = __n;
      QVar24.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar17,QVar24);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar16.m_size = (size_t)L"class";
      QVar16.field_0.m_data = aVar14.m_data;
      QVar23.m_size = __n;
      QVar23.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar16,QVar23);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_name == true) {
    pQVar1 = &((this->m_attr_name).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_name).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar19.m_size = (size_t)L"name";
      QVar19.field_0.m_data = aVar14.m_data;
      QVar26.m_size = __n;
      QVar26.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar19,QVar26);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar18.m_size = (size_t)L"name";
      QVar18.field_0.m_data = aVar14.m_data;
      QVar25.m_size = __n;
      QVar25.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeAttribute(QVar18,QVar25);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_native == true) {
    __n = (size_t)L"false";
    if (this->m_attr_native != false) {
      __n = (size_t)L"true";
    }
    QVar20.m_size = (size_t)L"native";
    QVar20.field_0.m_data = aVar14.m_data;
    QVar27.m_size = __n;
    QVar27.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeAttribute(QVar20,QVar27);
  }
  lVar2 = (this->m_class).d.size;
  if (lVar2 != 0) {
    pQVar3 = (this->m_class).d.ptr;
    lVar13 = 0;
    do {
      __n = *(size_t *)((long)&(pQVar3->d).ptr + lVar13);
      QVar21.m_size = (size_t)L"class";
      QVar21.field_0.m_data = aVar14.m_data;
      QVar28.m_size = __n;
      QVar28.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeTextElement(QVar21,QVar28);
      lVar13 = lVar13 + 0x18;
    } while (lVar2 * 0x18 != lVar13);
  }
  lVar2 = (this->m_property).d.size;
  if (lVar2 != 0) {
    ppDVar4 = (this->m_property).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"property";
      local_50.d.size = 8;
      DomProperty::write(*(DomProperty **)((long)ppDVar4 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_attribute).d.size;
  if (lVar2 != 0) {
    ppDVar4 = (this->m_attribute).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"attribute";
      local_50.d.size = 9;
      DomProperty::write(*(DomProperty **)((long)ppDVar4 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_row).d.size;
  if (lVar2 != 0) {
    ppDVar5 = (this->m_row).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"row";
      local_50.d.size = 3;
      DomRow::write(*(DomRow **)((long)ppDVar5 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_column).d.size;
  if (lVar2 != 0) {
    ppDVar6 = (this->m_column).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"column";
      local_50.d.size = 6;
      DomColumn::write(*(DomColumn **)((long)ppDVar6 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_item).d.size;
  if (lVar2 != 0) {
    ppDVar7 = (this->m_item).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"item";
      local_50.d.size = 4;
      DomItem::write(*(DomItem **)((long)ppDVar7 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_layout).d.size;
  if (lVar2 != 0) {
    ppDVar8 = (this->m_layout).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"layout";
      local_50.d.size = 6;
      DomLayout::write(*(DomLayout **)((long)ppDVar8 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_widget).d.size;
  if (lVar2 != 0) {
    ppDVar9 = (this->m_widget).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"widget";
      local_50.d.size = 6;
      write(*(DomWidget **)((long)ppDVar9 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_action).d.size;
  if (lVar2 != 0) {
    ppDVar10 = (this->m_action).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"action";
      local_50.d.size = 6;
      DomAction::write(*(DomAction **)((long)ppDVar10 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_actionGroup).d.size;
  if (lVar2 != 0) {
    ppDVar11 = (this->m_actionGroup).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"actiongroup";
      local_50.d.size = 0xb;
      DomActionGroup::write(*(DomActionGroup **)((long)ppDVar11 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_addAction).d.size;
  if (lVar2 != 0) {
    ppDVar12 = (this->m_addAction).d.ptr;
    lVar13 = 0;
    do {
      local_50.d.d = (Data *)0x0;
      local_50.d.ptr = L"addaction";
      local_50.d.size = 9;
      DomActionRef::write(*(DomActionRef **)((long)ppDVar12 + lVar13),__fd,&local_50,__n);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar2 << 3 != lVar13);
  }
  lVar2 = (this->m_zOrder).d.size;
  if (lVar2 != 0) {
    pQVar3 = (this->m_zOrder).d.ptr;
    lVar13 = 0;
    do {
      QVar22.m_size = (size_t)L"zorder";
      QVar22.field_0.m_data = aVar14.m_data;
      QVar29.m_size = *(size_t *)((long)&(pQVar3->d).ptr + lVar13);
      QVar29.field_0.m_data = (void *)0x8000000000000006;
      QXmlStreamWriter::writeTextElement(QVar22,QVar29);
      lVar13 = lVar13 + 0x18;
    } while (lVar2 * 0x18 != lVar13);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomWidget::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("widget") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeNative())
        writer.writeAttribute(u"native"_s, (attributeNative() ? u"true"_s : u"false"_s));

    for (const QString &v : m_class)
        writer.writeTextElement(u"class"_s, v);

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomRow *v : m_row)
        v->write(writer, u"row"_s);

    for (DomColumn *v : m_column)
        v->write(writer, u"column"_s);

    for (DomItem *v : m_item)
        v->write(writer, u"item"_s);

    for (DomLayout *v : m_layout)
        v->write(writer, u"layout"_s);

    for (DomWidget *v : m_widget)
        v->write(writer, u"widget"_s);

    for (DomAction *v : m_action)
        v->write(writer, u"action"_s);

    for (DomActionGroup *v : m_actionGroup)
        v->write(writer, u"actiongroup"_s);

    for (DomActionRef *v : m_addAction)
        v->write(writer, u"addaction"_s);

    for (const QString &v : m_zOrder)
        writer.writeTextElement(u"zorder"_s, v);

    writer.writeEndElement();
}